

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.cpp
# Opt level: O2

Node * __thiscall
SQCompilation::ClosureHoistingOpt::RemapTransformer::transformDeclExpr
          (RemapTransformer *this,DeclExpr *e)

{
  key_type this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  DeclExpr *pDVar4;
  iterator iVar5;
  iterator iVar6;
  Id *pIVar7;
  FunctionDecl *f;
  DeclExpr *local_20;
  key_type local_18;
  
  this_00 = (key_type)e->_decl;
  local_20 = e;
  iVar5 = std::
          _Rb_tree<SQCompilation::DeclExpr_*,_SQCompilation::DeclExpr_*,_std::_Identity<SQCompilation::DeclExpr_*>,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
          ::find((_Rb_tree<SQCompilation::DeclExpr_*,_SQCompilation::DeclExpr_*,_std::_Identity<SQCompilation::DeclExpr_*>,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
                  *)this->relocSet,&local_20);
  if ((((_Rb_tree_header *)iVar5._M_node ==
        &(this->relocSet->
         super_set<SQCompilation::DeclExpr_*,_std::less<SQCompilation::DeclExpr_*>,_StdArenaAllocator<SQCompilation::DeclExpr_*>_>
         )._M_t._M_impl.super__Rb_tree_header) &&
      ((this_00->super_Decl).super_Statement.super_Node._op == TO_FUNCTION)) &&
     (local_18 = this_00,
     iVar6 = std::
             _Rb_tree<SQCompilation::FunctionDecl_*,_std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>,_std::_Select1st<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
             ::find((_Rb_tree<SQCompilation::FunctionDecl_*,_std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>,_std::_Select1st<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
                     *)this->relocMap,&local_18), pDVar4 = local_20,
     (_Rb_tree_header *)iVar6._M_node !=
     &(this->relocMap->
      super_map<SQCompilation::FunctionDecl_*,_const_char_*,_std::less<SQCompilation::FunctionDecl_*>,_StdArenaAllocator<std::pair<SQCompilation::FunctionDecl_*const,_const_char_*>_>_>
      )._M_t._M_impl.super__Rb_tree_header)) {
    pIVar7 = createId(this,(char *)iVar6._M_node[1]._M_parent);
    iVar1 = (pDVar4->super_Expr).super_Node._coordinates.columnStart;
    iVar2 = (pDVar4->super_Expr).super_Node._coordinates.lineEnd;
    iVar3 = (pDVar4->super_Expr).super_Node._coordinates.columnEnd;
    (pIVar7->super_Expr).super_Node._coordinates.lineStart =
         (pDVar4->super_Expr).super_Node._coordinates.lineStart;
    (pIVar7->super_Expr).super_Node._coordinates.columnStart = iVar1;
    (pIVar7->super_Expr).super_Node._coordinates.lineEnd = iVar2;
    (pIVar7->super_Expr).super_Node._coordinates.columnEnd = iVar3;
    return (Node *)pIVar7;
  }
  Node::transformChildren((Node *)this_00,&this->super_Transformer);
  return (Node *)local_20;
}

Assistant:

Node *ClosureHoistingOpt::RemapTransformer::transformDeclExpr(DeclExpr *e) {

  Decl *d = e->declaration();
  auto it = relocSet.find(e);
  if (it == relocSet.end()) {
    if (d->op() == TO_FUNCTION) {
      FunctionDecl *f = (FunctionDecl *)d;
      auto it = relocMap.find(f);
      if (it != relocMap.end()) {
        return copyCoordinates(e, createId(it->second));
      }
    }
  }

  d->transformChildren(this);
  return e;
}